

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O1

void __thiscall POSGDiscrete::~POSGDiscrete(POSGDiscrete *this,void **vtt)

{
  void *pvVar1;
  pointer ppRVar2;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess =
       pvVar1;
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 + *(long *)((long)pvVar1 + -0x50)) = vtt[9];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[10];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0xb];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                super_MultiAgentDecisionProcess + -0x58)) = vtt[0xc];
  *(void **)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200 = vtt[0xd];
  ppRVar2 = (this->_m_p_rModel).
            super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar2 !=
      (this->_m_p_rModel).
      super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (*ppRVar2 != (RewardModelMapping *)0x0) {
        (*((*ppRVar2)->super_RewardModel).super_RewardModelDiscreteInterface.super_QTableInterface.
          _vptr_QTableInterface[3])();
      }
      ppRVar2 = ppRVar2 + 1;
    } while (ppRVar2 !=
             (this->_m_p_rModel).
             super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  ppRVar2 = (this->_m_p_rModel).
            super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar2 != (pointer)0x0) {
    operator_delete(ppRVar2,(long)(this->_m_p_rModel).
                                  super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppRVar2
                   );
  }
  pvVar1 = vtt[6];
  *(void **)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200 = pvVar1;
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200 +
            *(long *)((long)pvVar1 + -0x78)) = vtt[7];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200 + -0x40)
            ) = vtt[8];
  pvVar1 = *(void **)&this->field_0x230;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x240 - (long)pvVar1);
  }
  pvVar1 = *(void **)&this->field_0x218;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x228 - (long)pvVar1);
  }
  MultiAgentDecisionProcessDiscrete::~MultiAgentDecisionProcessDiscrete
            (&this->super_MultiAgentDecisionProcessDiscrete,vtt + 1);
  return;
}

Assistant:

POSGDiscrete::~POSGDiscrete()
{
    if(DEBUG_DPOMDPD)
        cout << "deleting POSGDiscrete (deleting rewards)"<<endl;
    for(vector<RewardModelMapping*>::iterator it = _m_p_rModel.begin();
            it != _m_p_rModel.end(); it++)
        delete *it;
}